

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O1

bool __thiscall TaskSpec::has_lock(TaskSpec *this,DatabaseLock *oth)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  anon_class_8_1_8991fb9c local_8;
  
  lVar2 = (long)(char)(oth->super__Variant_base<DatasetLock,_IteratorLock>).
                      super__Move_assign_alias<DatasetLock,_IteratorLock>.
                      super__Copy_assign_alias<DatasetLock,_IteratorLock>.
                      super__Move_ctor_alias<DatasetLock,_IteratorLock>.
                      super__Copy_ctor_alias<DatasetLock,_IteratorLock>.
                      super__Variant_storage_alias<DatasetLock,_IteratorLock>._M_index;
  local_8.this = (Database *)this;
  if (lVar2 != -1) {
    bVar1 = (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__deduce_visit_result<bool>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Task.cpp:46:23)_&&,_const_std::variant<DatasetLock,_IteratorLock>_&>
              ::_S_vtable._M_arr[lVar2]._M_data)(&local_8,oth);
    return bVar1;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar3 = &PTR__exception_00261370;
  puVar3[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar3,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

bool TaskSpec::has_lock(const DatabaseLock &oth) const {
    return std::visit([this](const auto &l) { return has_typed_lock(l); }, oth);
}